

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.cc
# Opt level: O0

shared_ptr<spdlog::logger> * lf::fe::DiffusionElementMatrixProviderLogger(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (DiffusionElementMatrixProviderLogger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&DiffusionElementMatrixProviderLogger()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"lf::fe::DiffusionElementMatrixProviderLogger",&local_29);
      lf::base::InitLogger((base *)&DiffusionElementMatrixProviderLogger::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::shared_ptr<spdlog::logger>::~shared_ptr,
                   &DiffusionElementMatrixProviderLogger::logger,&__dso_handle);
      __cxa_guard_release(&DiffusionElementMatrixProviderLogger()::logger);
    }
  }
  return &DiffusionElementMatrixProviderLogger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger>& DiffusionElementMatrixProviderLogger() {
  static auto logger =
      base::InitLogger("lf::fe::DiffusionElementMatrixProviderLogger");
  return logger;
}